

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall cmComputeLinkDepends::FollowLinkEntry(cmComputeLinkDepends *this,BFSEntry *qe)

{
  int depender_index;
  pointer pLVar1;
  cmGeneratorTarget *this_00;
  TargetType TVar2;
  cmLinkInterface *iface;
  pointer item;
  
  depender_index = qe->Index;
  pLVar1 = (this->EntryList).
           super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = pLVar1[depender_index].Target;
  if (this_00 != (cmGeneratorTarget *)0x0) {
    iface = cmGeneratorTarget::GetLinkInterface(this_00,&this->Config,this->Target);
    if (iface != (cmLinkInterface *)0x0) {
      TVar2 = cmGeneratorTarget::GetType(pLVar1[depender_index].Target);
      AddLinkEntries<cmLinkItem>
                (this,depender_index,(vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
      if (TVar2 != INTERFACE_LIBRARY) {
        FollowSharedDeps(this,depender_index,iface,false);
        for (item = (iface->WrongConfigLibraries).
                    super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                    super__Vector_impl_data._M_start;
            item != (iface->WrongConfigLibraries).
                    super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                    super__Vector_impl_data._M_finish; item = item + 1) {
          CheckWrongConfigItem(this,item);
        }
      }
    }
    return;
  }
  AddVarLinkEntries(this,depender_index,qe->LibDepends);
  return;
}

Assistant:

void cmComputeLinkDepends::FollowLinkEntry(BFSEntry const& qe)
{
  // Get this entry representation.
  int depender_index = qe.Index;
  LinkEntry const& entry = this->EntryList[depender_index];

  // Follow the item's dependencies.
  if(entry.Target)
    {
    // Follow the target dependencies.
    if(cmLinkInterface const* iface =
       entry.Target->GetLinkInterface(this->Config, this->Target))
      {
      const bool isIface =
                      entry.Target->GetType() == cmState::INTERFACE_LIBRARY;
      // This target provides its own link interface information.
      this->AddLinkEntries(depender_index, iface->Libraries);

      if (isIface)
        {
        return;
        }

      // Handle dependent shared libraries.
      this->FollowSharedDeps(depender_index, iface);

      // Support for CMP0003.
      for(std::vector<cmLinkItem>::const_iterator
            oi = iface->WrongConfigLibraries.begin();
          oi != iface->WrongConfigLibraries.end(); ++oi)
        {
        this->CheckWrongConfigItem(*oi);
        }
      }
    }
  else
    {
    // Follow the old-style dependency list.
    this->AddVarLinkEntries(depender_index, qe.LibDepends);
    }
}